

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voting.cpp
# Opt level: O1

void __thiscall CVoting::ClearOptions(CVoting *this)

{
  CHeap::Reset(&this->m_Heap);
  this->m_NumVoteOptions = 0;
  this->m_pFirst = (CVoteOptionClient *)0x0;
  this->m_pLast = (CVoteOptionClient *)0x0;
  this->m_pRecycleFirst = (CVoteOptionClient *)0x0;
  this->m_pRecycleLast = (CVoteOptionClient *)0x0;
  return;
}

Assistant:

void CVoting::ClearOptions()
{
	m_Heap.Reset();

	m_NumVoteOptions = 0;
	m_pFirst = 0;
	m_pLast = 0;

	m_pRecycleFirst = 0;
	m_pRecycleLast = 0;
}